

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::
Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>
::expand(Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>
         *this)

{
  int *piVar1;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
  *pVVar2;
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**> *pIVar3;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
  *pVVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  
  sVar7 = 8;
  if (this->_capacity != 0) {
    sVar7 = this->_capacity * 2;
  }
  uVar5 = sVar7 * 8;
  if (uVar5 == 0) {
    pVVar4 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
              *)FixedSizeAllocator<8UL>::alloc
                          ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar5 < 0x11) {
    pVVar4 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
              *)FixedSizeAllocator<16UL>::alloc
                          ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar5 < 0x19) {
    pVVar4 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
              *)FixedSizeAllocator<24UL>::alloc
                          ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar5 < 0x21) {
    pVVar4 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
              *)FixedSizeAllocator<32UL>::alloc
                          ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar5 < 0x31) {
    pVVar4 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
              *)FixedSizeAllocator<48UL>::alloc
                          ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar5 < 0x41) {
    pVVar4 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
              *)FixedSizeAllocator<64UL>::alloc
                          ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pVVar4 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
              *)::operator_new(uVar5,0x10);
  }
  if (this->_capacity != 0) {
    uVar5 = this->_capacity;
    if (uVar5 != 0) {
      uVar6 = 0;
      do {
        pVVar2 = this->_stack;
        pIVar3 = pVVar2[uVar6]._core;
        pVVar4[uVar6]._core = pIVar3;
        if (pIVar3 != (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
                       *)0x0) {
          pIVar3->_refCnt = pIVar3->_refCnt + 1;
        }
        pIVar3 = pVVar2[uVar6]._core;
        if (pIVar3 != (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
                       *)0x0) {
          piVar1 = &pIVar3->_refCnt;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            (*pIVar3->_vptr_IteratorCore[1])();
          }
        }
        uVar6 = uVar6 + 1;
        uVar5 = this->_capacity;
      } while (uVar6 < uVar5);
    }
    pVVar2 = this->_stack;
    if (pVVar2 != (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
                   *)0x0) {
      uVar5 = uVar5 * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar5 == 0) {
        pVVar2->_core =
             (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
              *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pVVar2;
      }
      else if (uVar5 < 0x11) {
        pVVar2->_core =
             (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
              *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pVVar2;
      }
      else if (uVar5 < 0x19) {
        pVVar2->_core =
             (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
              *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pVVar2;
      }
      else if (uVar5 < 0x21) {
        pVVar2->_core =
             (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
              *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pVVar2;
      }
      else if (uVar5 < 0x31) {
        pVVar2->_core =
             (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
              *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pVVar2;
      }
      else if (uVar5 < 0x41) {
        pVVar2->_core =
             (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
              *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pVVar2;
      }
      else {
        operator_delete(pVVar2,0x10);
      }
    }
  }
  this->_stack = pVVar4;
  this->_cursor = pVVar4 + this->_capacity;
  this->_end = pVVar4 + sVar7;
  this->_capacity = sVar7;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }